

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall
ON_Mesh::GetCurvatureStats(ON_Mesh *this,curvature_style kappa_style,ON_MeshCurvatureStats *stats)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  ON_MeshCurvatureStats *pOVar5;
  ON_3fVector *in_R8;
  
  stats->m_style = unknown_curvature_style;
  stats->m_infinity = 0.0;
  stats->m_count_infinite = 0;
  stats->m_count = 0;
  stats->m_mode = 0.0;
  stats->m_average = 0.0;
  stats->m_adev = 0.0;
  ON_Interval::Set(&stats->m_range,0.0,0.0);
  uVar1 = kappa_style - gaussian_curvature;
  if (uVar1 < 4) {
    iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    if (iVar2 < 1) {
      return false;
    }
    if ((this->m_K).m_count != iVar2) {
      return false;
    }
    pOVar5 = this->m_kstat[uVar1];
    if (pOVar5 == (ON_MeshCurvatureStats *)0x0) {
      pOVar5 = (ON_MeshCurvatureStats *)operator_new(0x40);
      ON_MeshCurvatureStats::ON_MeshCurvatureStats(pOVar5);
      this->m_kstat[uVar1] = pOVar5;
      ON_MeshCurvatureStats::Set(pOVar5,kappa_style,(this->m_K).m_count,(this->m_K).m_a,in_R8,0.0);
      pOVar5 = this->m_kstat[uVar1];
      if (pOVar5 == (ON_MeshCurvatureStats *)0x0) goto LAB_00501f0e;
    }
    bVar4 = true;
    if (pOVar5 != stats) {
      stats->m_style = pOVar5->m_style;
      stats->m_infinity = pOVar5->m_infinity;
      iVar2 = pOVar5->m_count;
      stats->m_count_infinite = pOVar5->m_count_infinite;
      stats->m_count = iVar2;
      dVar3 = pOVar5->m_average;
      stats->m_mode = pOVar5->m_mode;
      stats->m_average = dVar3;
      stats->m_adev = pOVar5->m_adev;
      dVar3 = (pOVar5->m_range).m_t[1];
      (stats->m_range).m_t[0] = (pOVar5->m_range).m_t[0];
      (stats->m_range).m_t[1] = dVar3;
    }
  }
  else {
LAB_00501f0e:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_Mesh::GetCurvatureStats( // returns true if successful
       ON::curvature_style kappa_style,
       ON_MeshCurvatureStats& stats
       ) const
{
  bool rc = false;
  stats.Destroy();
  int ksi;
  switch ( kappa_style ) {
    case ON::gaussian_curvature:
      ksi = 0;
      break;
    case ON::mean_curvature:
      ksi = 1;
      break;
    case ON::min_curvature: // minimum unsigned radius of curvature
      ksi = 2;
      break;
    case ON::max_curvature: // maximum unsigned radius of curvature
      ksi = 3;
      break;
    //case ON::section_curvature_x:
    //  ksi = 4;
    //  break;
    //case ON::section_curvature_y:
    //  ksi = 5;
    //  break;
    //case ON::section_curvature_z:
    //  ksi = 6;
    //  break;
    default:
      ksi = -1;
      break;
  }
  if ( ksi >= 0 && ksi <= 3 && HasPrincipalCurvatures() ) {
    ON_Mesh* p = (ON_Mesh*)this; // const lie 
    if ( !m_kstat[ksi] ) {
      p->m_kstat[ksi] = new ON_MeshCurvatureStats();
      p->m_kstat[ksi]->Set( kappa_style, m_K.Count(), m_K.Array(), m_N.Array() );
    }
    if ( p->m_kstat[ksi] ) {
      stats = *p->m_kstat[ksi];
      rc = true;
    }
  }
  return rc;
}